

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextstream.cpp
# Opt level: O1

bool __thiscall
QTextStreamPrivate::scan
          (QTextStreamPrivate *this,QChar **ptr,qsizetype *length,qsizetype maxlen,
          TokenDelimiter delimiter)

{
  char16_t cVar1;
  QIODevice *pQVar2;
  long lVar3;
  QString *pQVar4;
  bool bVar5;
  DataPointer *pDVar6;
  bool bVar7;
  int iVar8;
  qsizetype *pqVar9;
  qsizetype *pqVar10;
  char16_t *pcVar11;
  uint uVar12;
  long lVar13;
  long lVar14;
  char32_t cVar15;
  bool bVar16;
  char16_t cVar17;
  long lVar18;
  char16_t *local_70;
  
  pqVar9 = &this->readBufferOffset;
  if (this->device == (QIODevice *)0x0) {
    pqVar9 = &this->stringOffset;
  }
  lVar13 = *pqVar9;
  pqVar9 = &(this->readBuffer).d.size;
  cVar17 = L'\0';
  lVar18 = 0;
  lVar14 = 0;
  bVar16 = false;
  bVar5 = false;
  while( true ) {
    pQVar2 = this->device;
    if (pQVar2 == (QIODevice *)0x0) {
      local_70 = (this->string->d).ptr;
      if (local_70 == (char16_t *)0x0) {
        local_70 = L"";
      }
      pqVar10 = &(this->string->d).size;
    }
    else {
      local_70 = (this->readBuffer).d.ptr;
      pqVar10 = pqVar9;
      if (local_70 == (char16_t *)0x0) {
        local_70 = L"";
      }
    }
    if (((!bVar5) && (lVar3 = *pqVar10, lVar13 < lVar3)) && (maxlen == 0 || lVar18 < maxlen)) {
      do {
        cVar1 = local_70[lVar13];
        if (delimiter == EndOfLine) {
          bVar7 = cVar17 == L'\r';
          cVar17 = cVar1;
          if (cVar1 == L'\n') {
            bVar16 = true;
            bVar5 = true;
            lVar14 = (ulong)bVar7 + 1;
          }
        }
        else if (delimiter == NotSpace) {
          uVar12 = (ushort)cVar1 - 9;
          if ((0x17 < (ushort)uVar12) || (bVar7 = true, (0x80001fU >> (uVar12 & 0x1f) & 1) == 0)) {
            cVar15 = (char32_t)(ushort)cVar1;
            if ((uint)cVar15 < 0x80) {
              bVar7 = false;
            }
            else {
              bVar7 = true;
              if ((cVar15 != L'\x85') && (cVar15 != L'\xa0')) {
                bVar7 = QChar::isSpace_helper(cVar15);
              }
            }
          }
          if (bVar7 == false) {
            lVar14 = 1;
            bVar5 = true;
          }
        }
        else if (delimiter == Space) {
          uVar12 = (ushort)cVar1 - 9;
          if ((0x17 < (ushort)uVar12) || (bVar7 = true, (0x80001fU >> (uVar12 & 0x1f) & 1) == 0)) {
            cVar15 = (char32_t)(ushort)cVar1;
            if ((uint)cVar15 < 0x80) {
              bVar7 = false;
            }
            else {
              bVar7 = true;
              if ((cVar15 != L'\x85') && (cVar15 != L'\xa0')) {
                bVar7 = QChar::isSpace_helper(cVar15);
              }
            }
          }
          if (bVar7 != false) {
            bVar5 = true;
            lVar14 = 1;
          }
        }
        lVar18 = lVar18 + 1;
        lVar13 = lVar13 + 1;
      } while (((!bVar5) && (lVar13 < lVar3)) && (maxlen == 0 || lVar18 < maxlen));
    }
    if (bVar5) break;
    if (((pQVar2 == (QIODevice *)0x0) || (maxlen != 0 && maxlen <= lVar18)) ||
       (bVar7 = fillReadBuffer(this,-1), !bVar7)) break;
  }
  if (lVar18 != 0) {
    if (((0 < lVar18 && delimiter == EndOfLine) && !bVar5) &&
       (((this->string != (QString *)0x0 && (this->stringOffset + lVar18 == (this->string->d).size))
        || ((this->device != (QIODevice *)0x0 &&
            (iVar8 = (*this->device->_vptr_QIODevice[8])(), (char)iVar8 != '\0')))))) {
      bVar5 = true;
      if (cVar17 != L'\r') {
        bVar5 = bVar16;
      }
      bVar16 = bVar5;
      lVar14 = lVar14 + (ulong)(cVar17 == L'\r');
    }
    if (length != (qsizetype *)0x0) {
      *length = lVar18 - lVar14;
    }
    if (ptr != (QChar **)0x0) {
      pQVar4 = this->string;
      pDVar6 = &pQVar4->d;
      if (pQVar4 == (QString *)0x0) {
        pDVar6 = &(this->readBuffer).d;
      }
      pcVar11 = pDVar6->ptr;
      pqVar9 = &this->stringOffset;
      if (pQVar4 == (QString *)0x0) {
        pqVar9 = &this->readBufferOffset;
      }
      if (pcVar11 == (char16_t *)0x0) {
        pcVar11 = L"";
      }
      *ptr = (QChar *)(pcVar11 + *pqVar9);
    }
    if (bVar16) {
      lVar14 = 0;
    }
    this->lastTokenSize = lVar18 - lVar14;
  }
  return lVar18 != 0;
}

Assistant:

bool QTextStreamPrivate::scan(const QChar **ptr, qsizetype *length, qsizetype maxlen,
                              TokenDelimiter delimiter)
{
    qsizetype totalSize = 0;
    qsizetype delimSize = 0;
    bool consumeDelimiter = false;
    bool foundToken = false;
    qsizetype startOffset = device ? readBufferOffset : stringOffset;
    QChar lastChar;

    do {
        qsizetype endOffset;
        const QChar *chPtr;
        if (device) {
            chPtr = readBuffer.constData();
            endOffset = readBuffer.size();
        } else {
            chPtr = string->constData();
            endOffset = string->size();
        }
        chPtr += startOffset;

        for (; !foundToken && startOffset < endOffset && (!maxlen || totalSize < maxlen); ++startOffset) {
            const QChar ch = *chPtr++;
            ++totalSize;

            switch (delimiter) {
            case Space:
                if (ch.isSpace()) {
                    foundToken = true;
                    delimSize = 1;
                }
                break;
            case NotSpace:
                if (!ch.isSpace()) {
                    foundToken = true;
                    delimSize = 1;
                }
                break;
            case EndOfLine:
                if (ch == u'\n') {
                    foundToken = true;
                    delimSize = (lastChar == u'\r') ? 2 : 1;
                    consumeDelimiter = true;
                }
                lastChar = ch;
                break;
            }
        }
    } while (!foundToken
             && (!maxlen || totalSize < maxlen)
             && device && fillReadBuffer());

    if (totalSize == 0) {
#if defined (QTEXTSTREAM_DEBUG)
        qDebug("QTextStreamPrivate::scan() reached the end of input.");
#endif
        return false;
    }

    // if we find a '\r' at the end of the data when reading lines,
    // don't make it part of the line.
    if (delimiter == EndOfLine && totalSize > 0 && !foundToken) {
        if (((string && stringOffset + totalSize == string->size()) || (device && device->atEnd()))
            && lastChar == u'\r') {
            consumeDelimiter = true;
            ++delimSize;
        }
    }

    // set the read offset and length of the token
    if (length)
        *length = totalSize - delimSize;
    if (ptr)
        *ptr = readPtr();

    // update last token size. the callee will call consumeLastToken() when
    // done.
    lastTokenSize = totalSize;
    if (!consumeDelimiter)
        lastTokenSize -= delimSize;

#if defined (QTEXTSTREAM_DEBUG)
    qDebug("QTextStreamPrivate::scan(%p, %p, %d, %x) token length = %d, delimiter = %d",
           ptr, length, int(maxlen), uint(delimiter), int(totalSize - delimSize), int(delimSize));
#endif
    return true;
}